

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_as_strings.h
# Opt level: O1

string * join_as_strings<ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,std::vector<int,std::allocator<int>>>>>
                   (string *__return_storage_ptr__,
                   drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>
                   *range,string_view separator)

{
  basic_string_view<char,_std::char_traits<char>_> bStack_48;
  pointer local_38;
  pointer local_30;
  size_type local_28;
  undefined1 *local_20;
  size_t local_18;
  pointer local_10;
  
  local_10 = (pointer)separator._M_str;
  local_18 = separator._M_len;
  bStack_48._M_str =
       (char *)(range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_38 = (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_30 = (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (range->range).t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_28 = range->n;
  local_20 = &ezy::cpo::to_string;
  ezy::
  join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
            (__return_storage_ptr__,(ezy *)&bStack_48,
             (range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
              *)&stack0xffffffffffffffe8,&bStack_48);
  if ((pointer)bStack_48._M_str != (pointer)0x0) {
    operator_delete(bStack_48._M_str,(long)local_30 - (long)bStack_48._M_str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
join_as_strings(Range&& range, std::string_view separator = "")
{
  return ezy::join(ezy::transform(std::forward<Range>(range), ezy::to_string), separator);
}